

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O1

float TPZMatrix<float>::ReturnNearestValue(float val,TPZVec<float> *Vec,float tol)

{
  long lVar1;
  uint uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  
  fVar3 = *Vec->fStore;
  if (1 < Vec->fNElements) {
    uVar2 = -(uint)(ABS(val - fVar3) < ABS(tol));
    lVar1 = 1;
    fVar4 = fVar3;
    fVar5 = (float)(uVar2 & 0x501502f9 | ~uVar2 & (uint)(val - fVar3));
    do {
      fVar3 = Vec->fStore[lVar1];
      fVar6 = val - fVar3;
      fVar7 = ABS(fVar6);
      if (ABS(fVar5) <= fVar7 || fVar7 < ABS(tol)) {
        fVar3 = fVar4;
        fVar6 = fVar5;
      }
      lVar1 = lVar1 + 1;
      fVar4 = fVar3;
      fVar5 = fVar6;
    } while (Vec->fNElements != lVar1);
  }
  return fVar3;
}

Assistant:

T& operator[]( const int64_t index ) const
	{
#ifdef PZDEBUG
		if( index < 0 || index >= fNElements )
		{
            PZError << __PRETTY_FUNCTION__ << " acessing element out of range.";
            PZError << "|" << std::endl;
            PZError << "+-> NElements = " << NElements() << std::endl;
            PZError << "|" << std::endl;
            PZError << "+-> Index = " << index << std::endl;
            DebugStop();
            exit( -1 );
		}
#endif
		return fStore[ index ];
	}